

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O2

void __thiscall server::captureservmode::replenishammo(captureservmode *this,clientinfo *ci)

{
  int iVar1;
  baseinfo *pbVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int i;
  long lVar6;
  long lVar7;
  
  if ((((0x19 < gamemode + 3U) || ((0x85503fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) &&
      (this->notgotbases == false)) && (((ci->state).state == 0 && (ci->team[0] != '\0')))) {
    lVar7 = 0;
    for (lVar6 = 0; lVar6 < (this->bases).ulen; lVar6 = lVar6 + 1) {
      pbVar2 = (this->bases).buf;
      if (*(int *)((long)&pbVar2->ammotype + lVar7) - 1U < 6) {
        bVar3 = insidebase(this,(baseinfo *)(pbVar2->owner + lVar7 + -0xc),&(ci->state).o);
        if (((bVar3) &&
            (lVar4 = (long)*(int *)((long)&pbVar2->ammotype + lVar7),
            (ci->state).super_fpsstate.ammo[lVar4] <
            *(int *)((long)&PTR_flush_0017f510 + lVar4 * 0x20 + 4))) &&
           (bVar3 = baseinfo::takeammo((baseinfo *)(pbVar2->owner + lVar7 + -0xc),ci->team), bVar3))
        {
          sendbaseinfo(this,(int)lVar6);
          sendf(-1,1,"riii",0x44,(ulong)(uint)ci->clientnum,
                (ulong)*(uint *)((long)&pbVar2->ammotype + lVar7));
          lVar6 = (long)*(int *)((long)&pbVar2->ammotype + lVar7);
          iVar1 = *(int *)((long)&PTR_flush_0017f510 + lVar6 * 0x20 + 4);
          iVar5 = *(int *)(&PTR_flush_0017f510 + lVar6 * 4) + (ci->state).super_fpsstate.ammo[lVar6]
          ;
          if (iVar1 <= iVar5) {
            iVar5 = iVar1;
          }
          (ci->state).super_fpsstate.ammo[lVar6] = iVar5;
          return;
        }
      }
      lVar7 = lVar7 + 0x234;
    }
  }
  return;
}

Assistant:

void replenishammo(clientinfo *ci)
    {
        if(m_noitems || notgotbases || ci->state.state!=CS_ALIVE || !ci->team[0]) return;
        loopv(bases)
        {
            baseinfo &b = bases[i];
            if(b.valid() && insidebase(b, ci->state.o) && !ci->state.hasmaxammo(b.ammotype-1+I_SHELLS) && b.takeammo(ci->team))
            {
                sendbaseinfo(i);
                sendf(-1, 1, "riii", N_REPAMMO, ci->clientnum, b.ammotype);
                ci->state.addammo(b.ammotype);
                break;
            }
        }
    }